

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::OgreXmlSerializer::ReadSubMesh(OgreXmlSerializer *this,MeshXml *mesh)

{
  string *psVar1;
  pointer *pppSVar2;
  IndexDataXml *pIVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  SubMeshXml *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *pLVar7;
  undefined4 extraout_var_01;
  VertexDataXml *this_01;
  runtime_error *prVar8;
  SubMeshXml *submesh;
  aiFace face;
  SubMeshXml *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<Assimp::Ogre::SubMeshXml*,std::allocator<Assimp::Ogre::SubMeshXml*>> *local_1c0;
  MeshXml *local_1b8;
  undefined1 local_1b0 [8];
  uint *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_140 [264];
  char *local_38;
  
  this_00 = (SubMeshXml *)operator_new(0xa8);
  SubMeshXml::SubMeshXml(this_00);
  local_1e8 = this_00;
  iVar5 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"material");
  if (CONCAT44(extraout_var,iVar5) != 0) {
    ReadAttribute<std::__cxx11::string>((string *)local_1b0,this,"material");
    std::__cxx11::string::operator=
              ((string *)&(local_1e8->super_ISubMesh).materialRef,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
  }
  iVar5 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"usesharedvertices");
  if (CONCAT44(extraout_var_00,iVar5) != 0) {
    bVar4 = ReadAttribute<bool>(this,"usesharedvertices");
    (local_1e8->super_ISubMesh).usesSharedVertexData = bVar4;
  }
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [17])"Reading SubMesh ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar7,(char *)local_1e0[0]);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [16])"  - Material: \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0,(local_1e8->super_ISubMesh).materialRef._M_dataplus._M_p,
             (local_1e8->super_ISubMesh).materialRef._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar7,(char *)local_1e0[0]);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (char (*) [27])"  - Uses shared geometry: ");
  local_38 = "false";
  if ((local_1e8->super_ISubMesh).usesSharedVertexData != false) {
    local_38 = "true";
  }
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1b0,
             &local_38);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar7,(char *)local_1e0[0]);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  local_1c0 = (vector<Assimp::Ogre::SubMeshXml*,std::allocator<Assimp::Ogre::SubMeshXml*>> *)
              &mesh->subMeshes;
  local_1b8 = mesh;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  NextNode_abi_cxx11_(this);
  psVar1 = &this->m_currentNodeName;
  bVar4 = false;
  while( true ) {
    while( true ) {
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
          (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
         (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) {
        (local_1e8->super_ISubMesh).index =
             (uint)((ulong)((long)(local_1b8->subMeshes).
                                  super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_1b8->subMeshes).
                                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
        __position._M_current =
             (local_1b8->subMeshes).
             super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_1b8->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Ogre::SubMeshXml*,std::allocator<Assimp::Ogre::SubMeshXml*>>::
          _M_realloc_insert<Assimp::Ogre::SubMeshXml*const&>(local_1c0,__position,&local_1e8);
        }
        else {
          *__position._M_current = local_1e8;
          pppSVar2 = &(local_1b8->subMeshes).
                      super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar2 = *pppSVar2 + 1;
        }
        return;
      }
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) break;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        if ((local_1e8->super_ISubMesh).usesSharedVertexData == true) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1b0 = (undefined1  [8])local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,
                     "Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file."
                     ,"");
          std::runtime_error::runtime_error(prVar8,(string *)local_1b0);
          *(undefined ***)prVar8 = &PTR__runtime_error_008e3168;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        this_01 = (VertexDataXml *)operator_new(0xe0);
        VertexDataXml::VertexDataXml(this_01);
        local_1e8->vertexData = this_01;
        ReadGeometry(this,this_01);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) {
          ReadBoneAssignments(this,local_1e8->vertexData);
        }
        else {
          SkipCurrentNode_abi_cxx11_(this);
        }
      }
    }
    uVar6 = ReadAttribute<unsigned_int>(this,"count");
    local_1e8->indexData->faceCount = uVar6;
    std::vector<aiFace,_std::allocator<aiFace>_>::reserve
              (&local_1e8->indexData->faces,(ulong)local_1e8->indexData->faceCount);
    NextNode_abi_cxx11_(this);
    while (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 == 0) {
      local_1a8 = (uint *)0x0;
      local_1b0._0_4_ = 3;
      local_1a8 = (uint *)operator_new__(0xc);
      uVar6 = ReadAttribute<unsigned_int>(this,"v1");
      *local_1a8 = uVar6;
      uVar6 = ReadAttribute<unsigned_int>(this,"v2");
      local_1a8[1] = uVar6;
      uVar6 = ReadAttribute<unsigned_int>(this,"v3");
      local_1a8[2] = uVar6;
      if ((!bVar4) &&
         (iVar5 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"v4"),
         CONCAT44(extraout_var_01,iVar5) != 0)) {
        pLVar7 = DefaultLogger::get();
        bVar4 = true;
        Logger::warn(pLVar7,
                     "Submesh <face> has quads with <v4>, only triangles are supported at the moment!"
                    );
      }
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                (&local_1e8->indexData->faces,(value_type *)local_1b0);
      NextNode_abi_cxx11_(this);
      if (local_1a8 != (uint32_t *)0x0) {
        operator_delete__(local_1a8);
      }
    }
    pIVar3 = local_1e8->indexData;
    if ((long)(pIVar3->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pIVar3->faces).super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 != (ulong)pIVar3->faceCount) break;
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[11]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
               (char (*) [11])"  - Faces ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar7,(char *)local_1e0[0]);
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"Read only ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1b0," faces when should have read ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar8,(string *)local_1e0);
  *(undefined ***)prVar8 = &PTR__runtime_error_008e3168;
  __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadSubMesh(MeshXml *mesh)
{
    static const char *anMaterial          = "material";
    static const char *anUseSharedVertices = "usesharedvertices";
    static const char *anCount             = "count";
    static const char *anV1                = "v1";
    static const char *anV2                = "v2";
    static const char *anV3                = "v3";
    static const char *anV4                = "v4";

    SubMeshXml* submesh = new SubMeshXml();

    if (HasAttribute(anMaterial)) {
        submesh->materialRef = ReadAttribute<std::string>(anMaterial);
    }
    if (HasAttribute(anUseSharedVertices)) {
        submesh->usesSharedVertexData = ReadAttribute<bool>(anUseSharedVertices);
    }

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", (submesh->usesSharedVertexData ? "true" : "false"));

    // TODO: maybe we have always just 1 faces and 1 geometry and always in this order. this loop will only work correct, when the order
    // of faces and geometry changed, and not if we have more than one of one
    /// @todo Fix above comment with better read logic below

    bool quadWarned = false;

    NextNode();
    while(m_currentNodeName == nnFaces     ||
          m_currentNodeName == nnGeometry  ||
          m_currentNodeName == nnTextures  ||
          m_currentNodeName == nnBoneAssignments)
    {
        if (m_currentNodeName == nnFaces)
        {
            submesh->indexData->faceCount = ReadAttribute<uint32_t>(anCount);
            submesh->indexData->faces.reserve(submesh->indexData->faceCount);

            NextNode();
            while(m_currentNodeName == nnFace)
            {
                aiFace face;
                face.mNumIndices = 3;
                face.mIndices = new unsigned int[3];
                face.mIndices[0] = ReadAttribute<uint32_t>(anV1);
                face.mIndices[1] = ReadAttribute<uint32_t>(anV2);
                face.mIndices[2] = ReadAttribute<uint32_t>(anV3);

                /// @todo Support quads if Ogre even supports them in XML (I'm not sure but I doubt it)
                if (!quadWarned && HasAttribute(anV4)) {
                    ASSIMP_LOG_WARN("Submesh <face> has quads with <v4>, only triangles are supported at the moment!");
                    quadWarned = true;
                }

                submesh->indexData->faces.push_back(face);

                // Advance
                NextNode();
            }

            if (submesh->indexData->faces.size() == submesh->indexData->faceCount) {
                ASSIMP_LOG_DEBUG_F( "  - Faces ", submesh->indexData->faceCount);
            } else {
                throw DeadlyImportError(Formatter::format() << "Read only " << submesh->indexData->faces.size() << " faces when should have read " << submesh->indexData->faceCount);
            }
        } else if (m_currentNodeName == nnGeometry) {
            if (submesh->usesSharedVertexData) {
                throw DeadlyImportError("Found <geometry> in <submesh> when use shared geometry is true. Invalid mesh file.");
            }

            submesh->vertexData = new VertexDataXml();
            ReadGeometry(submesh->vertexData);
        } else if (m_currentNodeName == nnBoneAssignments) {
            ReadBoneAssignments(submesh->vertexData);
        }
        // Assimp incompatible/ignored nodes
        else {
            SkipCurrentNode();
        }
    }

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}